

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cpp
# Opt level: O1

int __thiscall ncnn::Scale::forward_inplace(Scale *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  int iVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_top_blobs;
  allocator_type local_39;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_38;
  
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector(&local_38,2,&local_39);
  pMVar4 = local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != bottom_top_blob) {
    piVar1 = bottom_top_blob->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if ((local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (*(local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
        }
      }
    }
    *(undefined8 *)((long)&pMVar4->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar4->elemsize + 4) = 0;
    pMVar4->data = (void *)0x0;
    pMVar4->refcount = (int *)0x0;
    pMVar4->dims = 0;
    pMVar4->w = 0;
    pMVar4->h = 0;
    pMVar4->c = 0;
    pMVar4->cstep = 0;
    piVar1 = bottom_top_blob->refcount;
    pMVar4->data = bottom_top_blob->data;
    pMVar4->refcount = piVar1;
    pMVar4->elemsize = bottom_top_blob->elemsize;
    pMVar4->packing = bottom_top_blob->packing;
    pMVar4->allocator = bottom_top_blob->allocator;
    iVar5 = bottom_top_blob->w;
    iVar2 = bottom_top_blob->h;
    iVar3 = bottom_top_blob->c;
    pMVar4->dims = bottom_top_blob->dims;
    pMVar4->w = iVar5;
    pMVar4->h = iVar2;
    pMVar4->c = iVar3;
    pMVar4->cstep = bottom_top_blob->cstep;
  }
  if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != &this->scale_data) {
    piVar1 = (this->scale_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (*(local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
        }
      }
    }
    *(undefined8 *)
     ((long)&local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount + 4) = 0;
    *(undefined8 *)
     ((long)&local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].data = (void *)0x0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].refcount = (int *)0x0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = 0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = 0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = 0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = 0;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = 0;
    piVar1 = (this->scale_data).refcount;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].data = (this->scale_data).data;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].refcount = piVar1;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].elemsize = (this->scale_data).elemsize;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].packing = (this->scale_data).packing;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].allocator = (this->scale_data).allocator;
    iVar5 = (this->scale_data).w;
    iVar2 = (this->scale_data).h;
    iVar3 = (this->scale_data).c;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].dims = (this->scale_data).dims;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].w = iVar5;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].h = iVar2;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].c = iVar3;
    local_38.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start[1].cstep = (this->scale_data).cstep;
  }
  iVar5 = (*(this->super_Layer)._vptr_Layer[8])(this,&local_38,opt);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_38);
  return iVar5;
}

Assistant:

int Scale::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    std::vector<Mat> bottom_top_blobs(2);
    bottom_top_blobs[0] = bottom_top_blob;
    bottom_top_blobs[1] = scale_data;

    return forward_inplace(bottom_top_blobs, opt);
}